

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O3

void asm_callid(ASMState *as,IRIns *ir,IRCallID id)

{
  anon_struct_8_4_c535eab0_for_IRIns_0 aVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined8 local_20;
  
  aVar1 = ir->field_0;
  auVar2._8_4_ = 0;
  auVar2._0_2_ = aVar1.op1;
  auVar2._2_2_ = aVar1.op2;
  auVar2._4_2_ = aVar1.ot;
  auVar2._6_2_ = aVar1.prev;
  auVar2._12_2_ = aVar1.prev;
  auVar3._8_2_ = aVar1.ot;
  auVar3._0_2_ = aVar1.op1;
  auVar3._2_2_ = aVar1.op2;
  auVar3._4_2_ = aVar1.ot;
  auVar3._6_2_ = aVar1.prev;
  auVar3._10_4_ = auVar2._10_4_;
  auVar5._6_8_ = 0;
  auVar5._0_6_ = auVar3._8_6_;
  auVar4._6_8_ = SUB148(auVar5 << 0x40,6);
  auVar4._4_2_ = aVar1.op2;
  auVar4._2_2_ = 0;
  auVar4._0_2_ = aVar1.op1;
  local_20 = auVar4._0_8_;
  asm_setupresult(as,ir,lj_ir_callinfo + id);
  asm_gencall(as,lj_ir_callinfo + id,(IRRef *)&local_20);
  return;
}

Assistant:

static void asm_callid(ASMState *as, IRIns *ir, IRCallID id)
{
  const CCallInfo *ci = &lj_ir_callinfo[id];
  IRRef args[2];
  args[0] = ir->op1;
  args[1] = ir->op2;
  asm_setupresult(as, ir, ci);
  asm_gencall(as, ci, args);
}